

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O3

void __thiscall xray_re::se_stalker::state_read(se_stalker *this,xr_packet *packet,uint16_t size)

{
  ushort uVar1;
  char *dest;
  uchar value;
  uchar value_1;
  uchar value_2;
  uchar value_3;
  char local_1e;
  char local_1d;
  char local_1c;
  char local_1b;
  char local_1a;
  char local_19;
  
  cse_alife_human_stalker::state_read(&this->super_cse_alife_human_stalker,packet,size);
  uVar1 = *(ushort *)
           &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
            super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x28;
  if (uVar1 < 0x80) {
    if (0x79 < uVar1) {
      if (0x7c < uVar1) {
        __assert_fail("m_version <= CSE_VERSION_CS",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x158,"virtual void xray_re::se_stalker::state_read(xr_packet &, uint16_t)");
      }
      xr_packet::r_raw(packet,&this->m_job_online,1);
      if (2 < this->m_job_online) {
        xr_packet::skip_sz(packet);
      }
      xr_packet::r_raw(packet,&local_1d,1);
      this->m_death_dropped = local_1d != '\0';
      if (*(ushort *)
           &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
            super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a < 7) {
        return;
      }
      xr_packet::r_sz(packet,&this->m_squad_id);
      if (*(ushort *)
           &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
            super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a < 8) {
        return;
      }
      xr_packet::r_raw(packet,&local_1c,1);
      this->m_sim_forced_online = local_1c != '\0';
      return;
    }
    if (uVar1 < 0x75) {
      if (uVar1 == 0x65) {
        if (*(ushort *)
             &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
              super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a < 2) {
          return;
        }
        xr_packet::r_raw(packet,&local_19,1);
        this->m_was_in_smart_terrain = local_19 != '\0';
        return;
      }
      if (uVar1 != 0x68) {
LAB_001a410f:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x176,"virtual void xray_re::se_stalker::state_read(xr_packet &, uint16_t)");
      }
    }
    else if (uVar1 != 0x75) {
      if (uVar1 != 0x76) goto LAB_001a410f;
      if (*(ushort *)
           &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
            super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a < 3) {
        return;
      }
      xr_packet::r_raw(packet,&this->m_job_online,1);
      if (2 < this->m_job_online) {
        xr_packet::skip_sz(packet);
      }
      if (*(ushort *)
           &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
            super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a < 5) {
        return;
      }
      xr_packet::r_raw(packet,&local_1b,1);
      this->m_was_in_smart_terrain = local_1b != '\0';
      if (*(ushort *)
           &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
            super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a < 6) {
        return;
      }
      dest = &local_1a;
      goto LAB_001a3eff;
    }
    if (2 < *(ushort *)
             &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
              super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a) {
      xr_packet::r_raw(packet,&this->m_job_online,1);
      return;
    }
  }
  else {
    if (uVar1 != 0x80) {
      __assert_fail("m_version <= CSE_VERSION_COP",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x152,"virtual void xray_re::se_stalker::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_sz(packet,&this->m_old_lvid);
    xr_packet::r_sz(packet,&this->m_active_section);
    dest = &local_1e;
LAB_001a3eff:
    xr_packet::r_raw(packet,dest,1);
    this->m_death_dropped = *dest != '\0';
  }
  return;
}

Assistant:

void se_stalker::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_human_stalker::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x80) {
		xr_assert(m_version <= CSE_VERSION_COP);
		packet.r_sz(m_old_lvid);
		packet.r_sz(m_active_section);
		packet.r_bool(m_death_dropped);
	}
	else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);
		packet.r_u8(m_job_online);
		if (m_job_online > 2)
			packet.skip_sz();
		packet.r_bool(m_death_dropped);
		if (m_script_version >= 7)
			packet.r_sz(m_squad_id);
		if (m_script_version >= 8)
			packet.r_bool(m_sim_forced_online);
	} else if (m_version == CSE_VERSION_SOC) {
		if (m_script_version >= 3) {
			packet.r_u8(m_job_online);
			if (m_job_online > 2)
				packet.skip_sz();
		}
		if (m_script_version >= 5)
			packet.r_bool(m_was_in_smart_terrain);
		if (m_script_version >= 6)
			packet.r_bool(m_death_dropped);
	} else if (m_version == CSE_VERSION_2232) {
		if (m_script_version >= 3)
			packet.r_u8(m_job_online);
	} else if (m_version == CSE_VERSION_2571) {
		if (m_script_version >= 3) {
			packet.r_u8(m_job_online);
		}	
	} else if (m_version == CSE_VERSION_2215) {
		if (m_script_version >= 2)
			packet.r_bool(m_was_in_smart_terrain);
	} else {
		xr_not_implemented();
	}
}